

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O1

void __thiscall cubeb_run_channel_rate_test_Test::TestBody(cubeb_run_channel_rate_test_Test *this)

{
  uint num_channels;
  int iVar1;
  AssertHelperData *this_00;
  stringstream *psVar2;
  int iVar3;
  long lVar4;
  char *message;
  bool bVar5;
  AssertionResult gtest_ar_;
  AssertHelper local_78;
  AssertionResult local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [2];
  uint local_4c;
  long local_48;
  long local_40;
  AssertHelper local_38;
  
  local_48 = 0;
  do {
    local_4c = *(uint *)((long)&DAT_00138330 + local_48);
    bVar5 = local_4c < 0x20;
    lVar4 = 0;
    do {
      num_channels = local_4c;
      iVar3 = *(int *)((long)&DAT_00138040 + lVar4);
      local_70.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_70.success_ = bVar5;
      if (0x1f < local_4c) {
        this_00 = (AssertHelperData *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)this_00);
        *(undefined8 *)
         ((long)&(this_00->message).c_str_ + *(long *)(*(long *)&this_00->line + -0x18)) = 0x11;
        local_78.data_ = this_00;
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)local_60,&local_70,"channels < MAX_NUM_CHANNELS","false","true");
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
                   ,0xee,(char *)local_60[0].ptr_);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_60[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_60[0].ptr_);
        }
        if (local_78.data_ != (AssertHelperData *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && (local_78.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
          local_78.data_ = (AssertHelperData *)0x0;
        }
        goto LAB_00118ed7;
      }
      local_40 = lVar4;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      fwrite("--------------------------\n",0x1b,1,_stderr);
      iVar1 = run_test(num_channels,iVar3,0);
      local_78.data_ = local_78.data_ & 0xffffffff00000000;
      local_60[0].ptr_._0_4_ = iVar1;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&local_70.success_,"run_test(channels, freq, 0)",(int *)local_60,
                 (anon_enum_32 *)&local_78);
      if (local_70.success_ == false) {
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (local_70.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_70.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0xf0;
        local_60[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
LAB_00118fad:
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
                   ,iVar3,message);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_60[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             (local_60[0].ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_60[0].ptr_ + 8))();
          }
          local_60[0].ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
LAB_00118ed7:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_70.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_60[0].ptr_._0_4_ = run_test(num_channels,iVar3,1);
      local_78.data_ = local_78.data_ & 0xffffffff00000000;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&local_70.success_,"run_test(channels, freq, 1)",(int *)local_60,
                 (anon_enum_32 *)&local_78);
      if (local_70.success_ == false) {
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (local_70.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_70.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0xf1;
        local_60[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
        goto LAB_00118fad;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = local_40 + 4;
    } while (lVar4 != 0x10);
    local_48 = local_48 + 4;
    if (local_48 == 0x14) {
      return;
    }
  } while( true );
}

Assistant:

TEST(cubeb, run_channel_rate_test)
{
  unsigned int channel_values[] = {
    1,
    2,
    3,
    4,
    6,
  };

  int freq_values[] = {
    16000,
    24000,
    44100,
    48000,
  };

  for(auto channels : channel_values) {
    for(auto freq : freq_values) {
      ASSERT_TRUE(channels < MAX_NUM_CHANNELS);
      fprintf(stderr, "--------------------------\n");
      ASSERT_EQ(run_test(channels, freq, 0), CUBEB_OK);
      ASSERT_EQ(run_test(channels, freq, 1), CUBEB_OK);
    }
  }
}